

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O3

MppBuffer camera_frame_to_buf(CamSource *ctx,RK_S32 idx)

{
  MppBuffer pvVar1;
  
  if ((idx < 0) || (pvVar1 = ctx->fbuf[(uint)idx].buffer, pvVar1 == (MppBuffer)0x0)) {
    pvVar1 = (MppBuffer)0x0;
  }
  else {
    mpp_buffer_sync_end_f(pvVar1,0,"camera_frame_to_buf");
  }
  return pvVar1;
}

Assistant:

MppBuffer camera_frame_to_buf(CamSource *ctx, RK_S32 idx)
{
    MppBuffer buf = NULL;

    if (idx < 0)
        return buf;

    buf = ctx->fbuf[idx].buffer;
    if (buf)
        mpp_buffer_sync_end(buf);

    return buf;
}